

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

StackSliceArray ts_stack_pop_pending(Stack *self,StackVersion version)

{
  StackSliceArray *pSVar1;
  uint uVar2;
  StackNode *pSVar3;
  StackNode *pSVar4;
  Subtree *pSVar5;
  StackSlice *pSVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  StackSliceArray SVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  undefined3 uVar15;
  _Bool _Var16;
  StackIterator *pSVar17;
  StackLink *pSVar18;
  bool local_105;
  StackVersion version_local;
  Stack *self_local;
  StackSliceArray pop;
  StackIterator current_iterator;
  StackLink link;
  StackIterator *next_iterator;
  undefined1 auStack_a0 [4];
  uint32_t j;
  SubtreeArray subtrees;
  _Bool should_stop;
  _Bool should_pop;
  StackAction action;
  StackNode *node;
  StackIterator *iterator_1;
  uint local_70;
  uint32_t size;
  uint32_t i;
  _Bool include_subtrees;
  StackIterator iterator;
  StackHead *head;
  
  (self->slices).size = 0;
  (self->iterators).size = 0;
  if ((self->heads).size <= version) {
    __assert_fail("(uint32_t)version < (&self->heads)->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                  ,0x118,
                  "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)");
  }
  iterator._24_8_ = (self->heads).contents + version;
  pSVar3 = ((StackHead *)iterator._24_8_)->node;
  iterator.node = (StackNode *)0x0;
  iterator.subtrees.contents._0_4_ = 0;
  iterator.subtrees.contents._4_4_ = 0;
  iterator.subtrees.size = 0;
  iterator.subtrees.capacity = CONCAT31(iterator.subtrees.capacity._1_3_,1);
  array__reserve((VoidArray *)&iterator,8,0);
  array__grow((VoidArray *)&self->iterators,0x20);
  uVar2 = (self->iterators).size;
  (self->iterators).size = uVar2 + 1;
  pSVar17 = (self->iterators).contents + uVar2;
  pSVar17->node = pSVar3;
  (pSVar17->subtrees).contents = (Subtree *)iterator.node;
  (pSVar17->subtrees).size = iterator.subtrees.contents._0_4_;
  (pSVar17->subtrees).capacity = iterator.subtrees.contents._4_4_;
  pSVar17->subtree_count = iterator.subtrees.size;
  pSVar17->is_pending = (_Bool)(char)iterator.subtrees.capacity;
  *(int3 *)&pSVar17->field_0x1d = (int3)(iterator.subtrees.capacity >> 8);
  do {
    if ((self->iterators).size == 0) {
      pSVar1 = &self->slices;
      pSVar6 = pSVar1->contents;
      uVar7 = (self->slices).size;
      uVar8 = (self->slices).capacity;
      uVar10 = pSVar1->contents;
      uVar11 = pSVar1->size;
      SVar9.size = uVar11;
      SVar9.contents = (StackSlice *)uVar10;
      if (uVar7 != 0) {
        ts_stack_renumber_version(self,pSVar6->version,version);
        pSVar6->version = version;
      }
      SVar9.capacity = uVar8;
      return SVar9;
    }
    local_70 = 0;
    iterator_1._4_4_ = (self->iterators).size;
    for (; local_70 < iterator_1._4_4_; local_70 = local_70 + 1) {
      pSVar17 = (self->iterators).contents + local_70;
      pSVar3 = pSVar17->node;
      subtrees.capacity = pop_pending_callback((void *)0x0,pSVar17);
      subtrees.size._3_1_ = (subtrees.capacity & 2) != 0;
      local_105 = true;
      if ((subtrees.capacity & 1) == 0) {
        local_105 = pSVar3->link_count == 0;
      }
      subtrees.size._2_1_ = local_105;
      if ((bool)subtrees.size._3_1_) {
        _auStack_a0 = (pSVar17->subtrees).contents;
        subtrees.contents = *(Subtree **)&(pSVar17->subtrees).size;
        if (local_105 == false) {
          ts_subtree_array_copy(pSVar17->subtrees,(SubtreeArray *)auStack_a0);
        }
        ts_subtree_array_reverse((SubtreeArray *)auStack_a0);
        ts_stack__add_slice(self,version,pSVar3,(SubtreeArray *)auStack_a0);
      }
      if ((subtrees.size._2_1_ & 1) == 0) {
        for (next_iterator._4_4_ = 1; next_iterator._4_4_ <= pSVar3->link_count;
            next_iterator._4_4_ = next_iterator._4_4_ + 1) {
          if (next_iterator._4_4_ == pSVar3->link_count) {
            current_iterator._24_8_ = pSVar3->links[0].node;
            link.node = (StackNode *)pSVar3->links[0].subtree.ptr;
            link.subtree = *(Subtree *)&pSVar3->links[0].is_pending;
            link._16_8_ = (self->iterators).contents + local_70;
LAB_0012fa9a:
            *(undefined8 *)link._16_8_ = current_iterator._24_8_;
            if (link.node == (StackNode *)0x0) {
              *(int *)(link._16_8_ + 0x18) = *(int *)(link._16_8_ + 0x18) + 1;
              *(undefined1 *)(link._16_8_ + 0x1c) = 0;
            }
            else {
              array__grow((VoidArray *)(link._16_8_ + 8),8);
              uVar2 = *(uint *)(link._16_8_ + 0x10);
              *(uint *)(link._16_8_ + 0x10) = uVar2 + 1;
              *(StackNode **)(*(long *)(link._16_8_ + 8) + (ulong)uVar2 * 8) = link.node;
              ts_subtree_retain((Subtree)link.node);
              _Var16 = ts_subtree_extra((Subtree)link.node);
              if ((!_Var16) &&
                 (*(int *)(link._16_8_ + 0x18) = *(int *)(link._16_8_ + 0x18) + 1,
                 ((ulong)link.subtree.ptr & 1) == 0)) {
                *(undefined1 *)(link._16_8_ + 0x1c) = 0;
              }
            }
          }
          else if ((self->iterators).size < 0x40) {
            pSVar18 = pSVar3->links + next_iterator._4_4_;
            current_iterator._24_8_ = pSVar18->node;
            link.node = (StackNode *)(pSVar18->subtree).ptr;
            link.subtree = *(Subtree *)&pSVar18->is_pending;
            pSVar17 = (self->iterators).contents + local_70;
            pSVar4 = pSVar17->node;
            pSVar5 = (pSVar17->subtrees).contents;
            uVar12 = (pSVar17->subtrees).size;
            uVar13 = (pSVar17->subtrees).capacity;
            uVar14 = pSVar17->subtree_count;
            _Var16 = pSVar17->is_pending;
            uVar15 = *(undefined3 *)&pSVar17->field_0x1d;
            array__grow((VoidArray *)&self->iterators,0x20);
            uVar2 = (self->iterators).size;
            (self->iterators).size = uVar2 + 1;
            pSVar17 = (self->iterators).contents + uVar2;
            pSVar17->node = pSVar4;
            (pSVar17->subtrees).contents = pSVar5;
            (pSVar17->subtrees).size = uVar12;
            (pSVar17->subtrees).capacity = uVar13;
            pSVar17->subtree_count = uVar14;
            pSVar17->is_pending = _Var16;
            *(undefined3 *)&pSVar17->field_0x1d = uVar15;
            if ((self->iterators).size <= (self->iterators).size - 1) {
              __assert_fail("(uint32_t)(&self->iterators)->size - 1 < (&self->iterators)->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                            ,0x151,
                            "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                           );
            }
            link._16_8_ = (self->iterators).contents + ((self->iterators).size - 1);
            ts_subtree_array_copy
                      (((StackIterator *)link._16_8_)->subtrees,
                       &((StackIterator *)link._16_8_)->subtrees);
            goto LAB_0012fa9a;
          }
        }
      }
      else {
        if ((subtrees.size._3_1_ & 1) == 0) {
          ts_subtree_array_delete(self->subtree_pool,&pSVar17->subtrees);
        }
        array__erase((VoidArray *)&self->iterators,0x20,local_70);
        local_70 = local_70 - 1;
        iterator_1._4_4_ = iterator_1._4_4_ - 1;
      }
    }
  } while( true );
}

Assistant:

StackSliceArray ts_stack_pop_pending(Stack *self, StackVersion version) {
  StackSliceArray pop = stack__iter(self, version, pop_pending_callback, NULL, 0);
  if (pop.size > 0) {
    ts_stack_renumber_version(self, pop.contents[0].version, version);
    pop.contents[0].version = version;
  }
  return pop;
}